

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

times * __thiscall
lest::for_test<lest::times>(lest *this,tests *specification,texts *in,times *perform,int n)

{
  bool bVar1;
  long *plVar2;
  int iVar3;
  times *ptVar4;
  int iVar5;
  fd_set *__exceptfds;
  int iVar6;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  long *plVar7;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  test local_88;
  
  iVar5 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar5 < 1);
  if (iVar5 == -1 || iVar5 >= 1) {
    iVar6 = 0;
    do {
      plVar2 = *(long **)(this + 8);
      for (plVar7 = *(long **)this; plVar7 != plVar2; plVar7 = plVar7 + 8) {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char*>((string *)local_a8,*plVar7,plVar7[1] + *plVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)specification);
        iVar3 = select((int)(string *)local_a8,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                       __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffb8);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        if ((char)iVar3 == '\0') {
LAB_00108c17:
          bVar1 = true;
        }
        else {
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar7,plVar7[1] + *plVar7)
          ;
          std::function<void_(lest::env_&)>::function
                    (&local_88.behaviour,(function<void_(lest::env_&)> *)(plVar7 + 4));
          ptVar4 = times::operator()((times *)in,&local_88);
          iVar3 = ptVar4->failures;
          bVar1 = (ptVar4->output).opt.abort;
          if (local_88.behaviour.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_88.behaviour.super__Function_base._M_manager)
                      ((_Any_data *)&local_88.behaviour,(_Any_data *)&local_88.behaviour,
                       __destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
            operator_delete(local_88.name._M_dataplus._M_p);
          }
          if ((0 < iVar3 & bVar1) == 0) goto LAB_00108c17;
          bVar1 = false;
        }
        if (!bVar1) break;
      }
      if (plVar7 != plVar2) {
        return (times *)in;
      }
      iVar6 = iVar6 + 1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),iVar5 <= iVar6);
    } while (iVar5 == -1 || iVar5 > iVar6);
  }
  return (times *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}